

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O3

boolean e_missed(entity *etmp,boolean chunks)

{
  char cVar1;
  int iVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar3 = automiss(etmp);
  if (bVar3 != '\0') {
    return '\x01';
  }
  if ((etmp->edata->mflags1 & 1) != 0) {
    if (etmp->emon == &youmonst) {
      iVar4 = 5;
      if (u.uprops[0x1f].extrinsic == 0 && u.uprops[0x1f].intrinsic == 0) goto LAB_0015f1ec;
    }
    else {
      iVar4 = 5;
      if ((*(uint *)&etmp->emon->field_0x60 & 0xc0000) == 0x40000) goto LAB_0015f1ec;
    }
  }
  iVar4 = 3;
  if ((etmp->edata->mlet != '\x05') &&
     (((etmp->emon != &youmonst ||
       ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0 &&
        ((youmonst.data)->mlet != '\x05')))) && (iVar4 = 0, chunks != '\0')))) {
    uVar5 = etmp->ex;
    uVar6 = (ulong)(uint)etmp->ey;
    if (uVar5 - 1 < 0x4f && uVar6 < 0x15) {
      cVar1 = level->locations[uVar5][uVar6].typ;
      iVar4 = 2;
      if (((byte)(cVar1 - 0x11U) < 3) ||
         ((cVar1 == '\x14' && ((*(ushort *)&level->locations[uVar5][uVar6].field_0x6 & 0x1c0) == 0))
         )) goto LAB_0015f1ec;
    }
    iVar4 = 0;
  }
LAB_0015f1ec:
  iVar2 = iVar4 + -3;
  if (level->locations[etmp->ex][etmp->ey].typ != '\f') {
    iVar2 = iVar4;
  }
  uVar5 = mt_random();
  return (int)(uVar5 & 7) < iVar2;
}

Assistant:

static boolean e_missed(struct entity *etmp, boolean chunks)
{
	int misses;

	if (automiss(etmp))
		return TRUE;

	if (is_flyer(etmp->edata) &&
	    (is_u(etmp)? !Sleeping :
	     (etmp->emon->mcanmove && !etmp->emon->msleeping)))
						 /* flying requires mobility */
		misses = 5;	/* out of 8 */
	else if (is_floater(etmp->edata) ||
		    (is_u(etmp) && Levitation))	 /* doesn't require mobility */
		misses = 3;
	else if (chunks && is_pool(level, etmp->ex, etmp->ey))
		misses = 2;				    /* sitting ducks */
	else
		misses = 0;

	if (is_db_wall(etmp->ex, etmp->ey))
		misses -= 3;				    /* less airspace */


	return (boolean)((misses >= rnd(8))? TRUE : FALSE);
}